

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O1

void __thiscall HighsSimplexAnalysis::reportOneDensity(HighsSimplexAnalysis *this,double density)

{
  int iVar1;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  double dVar3;
  string local_30;
  
  iVar1 = 99;
  if (0.0 < density) {
    dVar3 = log(density);
    iVar1 = (int)((dVar3 * -2.0) / 2.302585092994046);
  }
  pbVar2 = (this->analysis_log)._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl + 0x10;
  if (iVar1 < -0x62) {
    highsFormatToString_abi_cxx11_(&local_30,"     ");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pbVar2,local_30._M_dataplus._M_p,local_30._M_string_length);
  }
  else {
    highsFormatToString_abi_cxx11_(&local_30," %4d");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pbVar2,local_30._M_dataplus._M_p,local_30._M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

void HighsSimplexAnalysis::reportOneDensity(const double density) {
  assert(
      // analyse_simplex_summary_data ||
      analyse_simplex_runtime_data);
  const HighsInt log_10_density = intLog10(density);
  if (log_10_density > -99) {
    *analysis_log << highsFormatToString(" %4" HIGHSINT_FORMAT "",
                                         log_10_density);
  } else {
    *analysis_log << highsFormatToString("     ");
  }
}